

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O0

void __thiscall
BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
::BT(BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
     *this,function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
           *v,cmListFileBacktrace *bt)

{
  cmListFileBacktrace *bt_local;
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  *v_local;
  BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
  *this_local;
  
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::function(&this->Value,v);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,bt);
  return;
}

Assistant:

BT(T v = T(), cmListFileBacktrace bt = cmListFileBacktrace())
    : Value(std::move(v))
    , Backtrace(std::move(bt))
  {
  }